

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

string * __thiscall
flatbuffers::Parser::ConformTo_abi_cxx11_(string *__return_storage_ptr__,Parser *this,Parser *base)

{
  FieldDef *name;
  bool bVar1;
  reference ppSVar2;
  StructDef *pSVar3;
  reference ppFVar4;
  reference ppEVar5;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar6;
  reference ppEVar7;
  char *__s;
  pair<std::_Rb_tree_const_iterator<flatbuffers::FieldDef_*>,_bool> pVar8;
  allocator<char> local_2da;
  allocator<char> local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  EnumVal *local_298;
  EnumVal *enum_val_base;
  EnumVal *enum_val;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_280;
  const_iterator evit;
  EnumDef *enum_def_base;
  string qualified_name_1;
  EnumDef *enum_def;
  __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_240;
  iterator eit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  FieldDef *local_1f8;
  FieldDef *field_1;
  FieldDef *local_1e8;
  _Self local_1e0;
  FieldDef *local_1d8;
  FieldDef *field_base_1;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_1c8;
  iterator fit_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> qualified_field_base;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_110;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_108;
  iterator fbit;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> qualified_field_name;
  FieldDef *field_base;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_a8;
  iterator fit;
  set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
  renamed_fields;
  StructDef *struct_def_base;
  string qualified_name;
  StructDef *struct_def;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_28;
  iterator sit;
  Parser *base_local;
  Parser *this_local;
  
  sit._M_current = (StructDef **)base;
  local_28._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(this->structs_).vec);
  do {
    struct_def = (StructDef *)
                 std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                 end(&(this->structs_).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                        *)&struct_def);
    if (!bVar1) {
      local_240._M_current =
           (EnumDef **)
           std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                     (&(this->enums_).vec);
      do {
        enum_def = (EnumDef *)
                   std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                             (&(this->enums_).vec);
        bVar1 = __gnu_cxx::operator!=
                          (&local_240,
                           (__normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                            *)&enum_def);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",&local_2da);
          std::allocator<char>::~allocator(&local_2da);
          return __return_storage_ptr__;
        }
        ppEVar5 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                  ::operator*(&local_240);
        qualified_name_1.field_2._8_8_ = *ppEVar5;
        Namespace::GetFullyQualifiedName
                  ((string *)&enum_def_base,
                   (((EnumDef *)qualified_name_1.field_2._8_8_)->super_Definition).defined_namespace
                   ,(string *)qualified_name_1.field_2._8_8_,1000);
        evit._M_current =
             (EnumVal **)
             SymbolTable<flatbuffers::EnumDef>::Lookup
                       ((SymbolTable<flatbuffers::EnumDef> *)(sit._M_current + 0x1e),
                        (string *)&enum_def_base);
        if ((EnumDef *)evit._M_current == (EnumDef *)0x0) {
          renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x10;
        }
        else {
          pvVar6 = EnumDef::Vals((EnumDef *)qualified_name_1.field_2._8_8_);
          local_280._M_current =
               (EnumVal **)
               std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                         (pvVar6);
          while( true ) {
            pvVar6 = EnumDef::Vals((EnumDef *)qualified_name_1.field_2._8_8_);
            enum_val = (EnumVal *)
                       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                       ::end(pvVar6);
            bVar1 = __gnu_cxx::operator!=
                              (&local_280,
                               (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                                *)&enum_val);
            if (!bVar1) break;
            ppEVar7 = __gnu_cxx::
                      __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                      ::operator*(&local_280);
            enum_val_base = *ppEVar7;
            local_298 = EnumDef::Lookup((EnumDef *)evit._M_current,&enum_val_base->name);
            if ((local_298 != (EnumVal *)0x0) &&
               (bVar1 = flatbuffers::operator!=(enum_val_base,local_298), bVar1)) {
              std::operator+(__return_storage_ptr__,"values differ for enum: ",&enum_val_base->name)
              ;
              renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
              goto LAB_001388a3;
            }
            __gnu_cxx::
            __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
            ::operator++(&local_280);
          }
          if (*(int *)(evit._M_current + 0x1a) == *(int *)(qualified_name_1.field_2._8_8_ + 0xd0)) {
            renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
          }
          else {
            __s = "enum: ";
            if ((*(byte *)(qualified_name_1.field_2._8_8_ + 200) & 1) != 0) {
              __s = "union: ";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,__s,&local_2d9);
            std::operator+(&local_2b8,"underlying type differ for ",&local_2d8);
            std::operator+(__return_storage_ptr__,&local_2b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &enum_def_base);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::__cxx11::string::~string((string *)&local_2d8);
            std::allocator<char>::~allocator(&local_2d9);
            renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
          }
        }
LAB_001388a3:
        std::__cxx11::string::~string((string *)&enum_def_base);
        if (((int)renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
           ((int)renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count == 1)) {
          return __return_storage_ptr__;
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
        ::operator++(&local_240);
      } while( true );
    }
    ppSVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_28);
    qualified_name.field_2._8_8_ = *ppSVar2;
    Namespace::GetFullyQualifiedName
              ((string *)&struct_def_base,
               (((StructDef *)qualified_name.field_2._8_8_)->super_Definition).defined_namespace,
               (string *)qualified_name.field_2._8_8_,1000);
    pSVar3 = LookupStruct((Parser *)sit._M_current,(string *)&struct_def_base);
    if (pSVar3 == (StructDef *)0x0) {
      renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4;
    }
    else {
      std::
      set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
      ::set((set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
             *)&fit);
      local_a8._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      (qualified_name.field_2._8_8_ + 0xf8));
      while( true ) {
        field = (FieldDef *)
                std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                          ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                            *)(qualified_name.field_2._8_8_ + 0xf8));
        bVar1 = __gnu_cxx::operator!=
                          (&local_a8,
                           (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                            *)&field);
        if (!bVar1) break;
        ppFVar4 = __gnu_cxx::
                  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                  ::operator*(&local_a8);
        name = *ppFVar4;
        qualified_field_name.field_2._8_8_ =
             SymbolTable<flatbuffers::FieldDef>::Lookup(&pSVar3->fields,(string *)name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fbit,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &struct_def_base,".");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fbit,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
        std::__cxx11::string::~string((string *)&fbit);
        if (qualified_field_name.field_2._8_8_ == 0) {
          local_108._M_current =
               (FieldDef **)
               std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                         (&(pSVar3->fields).vec);
          while( true ) {
            local_110._M_current =
                 (FieldDef **)
                 std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                           (&(pSVar3->fields).vec);
            bVar1 = __gnu_cxx::operator!=(&local_108,&local_110);
            if (!bVar1) break;
            ppFVar4 = __gnu_cxx::
                      __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                      ::operator*(&local_108);
            qualified_field_name.field_2._8_8_ = *ppFVar4;
            if ((name->value).offset ==
                (((FieldDef *)qualified_field_name.field_2._8_8_)->value).offset) {
              pVar8 = std::
                      set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                      ::insert((set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                                *)&fit,(value_type *)((long)&qualified_field_name.field_2 + 8));
              qualified_field_base.field_2._8_8_ = pVar8.first._M_node;
              bVar1 = EqualByName(&(name->value).type,
                                  (Type *)(qualified_field_name.field_2._8_8_ + 200));
              if (!bVar1) {
                std::operator+(&local_160,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &struct_def_base,".");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_140,&local_160,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               qualified_field_name.field_2._8_8_);
                std::__cxx11::string::~string((string *)&local_160);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &fit_1,"field renamed to different type: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_e0);
                std::operator+(&local_1a0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &fit_1," (renamed from ");
                std::operator+(&local_180,&local_1a0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_140);
                std::operator+(__return_storage_ptr__,&local_180,")");
                std::__cxx11::string::~string((string *)&local_180);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::__cxx11::string::~string((string *)&fit_1);
                renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
                std::__cxx11::string::~string((string *)local_140);
                goto LAB_00138303;
              }
              break;
            }
            __gnu_cxx::
            __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
            ::operator++(&local_108);
          }
LAB_001382fc:
          renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
        }
        else if ((name->value).offset == *(voffset_t *)(qualified_field_name.field_2._8_8_ + 0x108))
        {
          bVar1 = std::operator!=(&(name->value).constant,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(qualified_field_name.field_2._8_8_ + 0xe8));
          if (bVar1) {
            std::operator+(__return_storage_ptr__,"defaults differ for field: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0);
            renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
          }
          else {
            bVar1 = EqualByName(&(name->value).type,
                                (Type *)(qualified_field_name.field_2._8_8_ + 200));
            if (bVar1) {
              if ((name->offset64 & 1U) ==
                  (*(byte *)(qualified_field_name.field_2._8_8_ + 0x115) & 1)) goto LAB_001382fc;
              std::operator+(__return_storage_ptr__,"offset types differ for field: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0);
              renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
            }
            else {
              std::operator+(__return_storage_ptr__,"types differ for field: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0);
              renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
            }
          }
        }
        else {
          std::operator+(__return_storage_ptr__,"offsets differ for field: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e0);
          renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
        }
LAB_00138303:
        std::__cxx11::string::~string((string *)local_e0);
        if ((int)renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
        goto LAB_0013850d;
        __gnu_cxx::
        __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        ::operator++(&local_a8);
      }
      local_1c8._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (&(pSVar3->fields).vec);
      while( true ) {
        field_base_1 = (FieldDef *)
                       std::
                       vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                       end(&(pSVar3->fields).vec);
        bVar1 = __gnu_cxx::operator!=
                          (&local_1c8,
                           (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                            *)&field_base_1);
        if (!bVar1) break;
        ppFVar4 = __gnu_cxx::
                  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                  ::operator*(&local_1c8);
        local_1e8 = *ppFVar4;
        local_1d8 = local_1e8;
        local_1e0._M_node =
             (_Base_ptr)
             std::
             set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
             ::find((set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                     *)&fit,&local_1e8);
        field_1 = (FieldDef *)
                  std::
                  set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                  ::end((set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                         *)&fit);
        bVar1 = std::operator==(&local_1e0,(_Self *)&field_1);
        if ((bVar1) &&
           (local_1f8 = SymbolTable<flatbuffers::FieldDef>::Lookup
                                  ((SymbolTable<flatbuffers::FieldDef> *)
                                   (qualified_name.field_2._8_8_ + 200),(string *)local_1d8),
           local_1f8 == (FieldDef *)0x0)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eit,
                         "field deleted: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &struct_def_base);
          std::operator+(&local_218,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eit,
                         ".");
          std::operator+(__return_storage_ptr__,&local_218,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&eit);
          renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
          goto LAB_0013850d;
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        ::operator++(&local_1c8);
      }
      renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
LAB_0013850d:
      std::
      set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
      ::~set((set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
              *)&fit);
    }
    std::__cxx11::string::~string((string *)&struct_def_base);
    if (((int)renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       ((int)renamed_fields._M_t._M_impl.super__Rb_tree_header._M_node_count == 1)) {
      return __return_storage_ptr__;
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

std::string Parser::ConformTo(const Parser &base) {
  for (auto sit = structs_.vec.begin(); sit != structs_.vec.end(); ++sit) {
    auto &struct_def = **sit;
    auto qualified_name =
        struct_def.defined_namespace->GetFullyQualifiedName(struct_def.name);
    auto struct_def_base = base.LookupStruct(qualified_name);
    if (!struct_def_base) continue;
    std::set<FieldDef *> renamed_fields;
    for (auto fit = struct_def.fields.vec.begin();
         fit != struct_def.fields.vec.end(); ++fit) {
      auto &field = **fit;
      auto field_base = struct_def_base->fields.Lookup(field.name);
      const auto qualified_field_name = qualified_name + "." + field.name;
      if (field_base) {
        if (field.value.offset != field_base->value.offset) {
          return "offsets differ for field: " + qualified_field_name;
        }
        if (field.value.constant != field_base->value.constant) {
          return "defaults differ for field: " + qualified_field_name;
        }
        if (!EqualByName(field.value.type, field_base->value.type)) {
          return "types differ for field: " + qualified_field_name;
        }
        if (field.offset64 != field_base->offset64) {
          return "offset types differ for field: " + qualified_field_name;
        }
      } else {
        // Doesn't have to exist, deleting fields is fine.
        // But we should check if there is a field that has the same offset
        // but is incompatible (in the case of field renaming).
        for (auto fbit = struct_def_base->fields.vec.begin();
             fbit != struct_def_base->fields.vec.end(); ++fbit) {
          field_base = *fbit;
          if (field.value.offset == field_base->value.offset) {
            renamed_fields.insert(field_base);
            if (!EqualByName(field.value.type, field_base->value.type)) {
              const auto qualified_field_base =
                  qualified_name + "." + field_base->name;
              return "field renamed to different type: " +
                     qualified_field_name + " (renamed from " +
                     qualified_field_base + ")";
            }
            break;
          }
        }
      }
    }
    // deletion of trailing fields are not allowed
    for (auto fit = struct_def_base->fields.vec.begin();
         fit != struct_def_base->fields.vec.end(); ++fit) {
      auto &field_base = **fit;
      // not a renamed field
      if (renamed_fields.find(&field_base) == renamed_fields.end()) {
        auto field = struct_def.fields.Lookup(field_base.name);
        if (!field) {
          return "field deleted: " + qualified_name + "." + field_base.name;
        }
      }
    }
  }

  for (auto eit = enums_.vec.begin(); eit != enums_.vec.end(); ++eit) {
    auto &enum_def = **eit;
    auto qualified_name =
        enum_def.defined_namespace->GetFullyQualifiedName(enum_def.name);
    auto enum_def_base = base.enums_.Lookup(qualified_name);
    if (!enum_def_base) continue;
    for (auto evit = enum_def.Vals().begin(); evit != enum_def.Vals().end();
         ++evit) {
      auto &enum_val = **evit;
      auto enum_val_base = enum_def_base->Lookup(enum_val.name);
      if (enum_val_base) {
        if (enum_val != *enum_val_base)
          return "values differ for enum: " + enum_val.name;
      }
    }
    // Check underlying type changes
    if (enum_def_base->underlying_type.base_type != enum_def.underlying_type.base_type) {
      return "underlying type differ for " + std::string(enum_def.is_union ? "union: " : "enum: ") + qualified_name;
    }
  }
  return "";
}